

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O0

void __thiscall
HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableTest(HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *this)

{
  undefined8 *in_RDI;
  Test *in_stack_ffffffffffffffc0;
  key_equal *in_stack_ffffffffffffffc8;
  hasher *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffe0;
  Hasher local_14;
  
  testing::Test::Test(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__HashtableTest_012fd378;
  Hasher::Hasher(&local_14,0);
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffd0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffc0,0,
             (int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8,(allocator_type *)in_stack_ffffffffffffffc0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

HashtableTest() : ht_() {}